

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O3

int archive_write_pax_header_xattrs(archive_write *a,pax *pax,archive_entry *entry)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  archive_string *paVar4;
  size_t value_len;
  char *value_00;
  wchar_t wVar5;
  wchar_t wVar6;
  byte *pbVar7;
  byte *__s;
  size_t sVar8;
  int *piVar9;
  char *__s_00;
  char *pcVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  char *p;
  byte bVar15;
  long lVar16;
  int iVar17;
  byte *pbVar18;
  bool bVar19;
  size_t size;
  void *value;
  char *name;
  archive_string local_88;
  archive_string *local_68;
  archive_write *local_60;
  archive_string *local_58;
  archive_entry *local_50;
  size_t local_48;
  char *local_40;
  byte *local_38;
  
  local_50 = entry;
  wVar5 = archive_entry_xattr_reset(entry);
  if (wVar5 != L'\0') {
    local_58 = &pax->l_url_encoded_name;
    local_68 = &pax->pax_header;
    local_60 = a;
    do {
      archive_entry_xattr_next(local_50,(char **)&local_38,&local_40,&local_48);
      bVar15 = *local_38;
      if (bVar15 == 0) {
        pbVar7 = (byte *)malloc(1);
        __s = pbVar7;
        if (pbVar7 == (byte *)0x0) goto LAB_0042192f;
LAB_004218e3:
        *pbVar7 = 0;
        sVar8 = strlen((char *)__s);
        paVar4 = local_58;
        wVar6 = archive_strncpy_l(local_58,__s,sVar8,pax->sconv_utf8);
        free(__s);
        if (wVar6 == L'\0') {
          p = paVar4->s;
        }
        else {
          piVar9 = __errno_location();
          if (*piVar9 == 0xc) {
            archive_set_error(&local_60->archive,0xc,"Can\'t allocate memory for Linkname");
            return -0x1e;
          }
          p = (char *)0x0;
        }
      }
      else {
        pbVar18 = local_38 + 1;
        iVar17 = 0;
        pbVar7 = pbVar18;
        bVar11 = bVar15;
        do {
          bVar19 = (byte)(bVar11 + 0x81) < 0xa2;
          iVar13 = bVar19 + 1 + (uint)bVar19;
          if (bVar11 == 0x25) {
            iVar13 = 3;
          }
          if (bVar11 == 0x3d) {
            iVar13 = 3;
          }
          iVar17 = iVar17 + iVar13;
          bVar11 = *pbVar7;
          pbVar7 = pbVar7 + 1;
        } while (bVar11 != 0);
        __s = (byte *)malloc((ulong)(iVar17 + 1));
        pbVar7 = __s;
        if (__s != (byte *)0x0) {
          do {
            if (((((char)bVar15 < '!') || (bVar15 == 0x25)) || (bVar15 == 0x7f)) || (bVar15 == 0x3d)
               ) {
              *pbVar7 = 0x25;
              pbVar7[1] = "0123456789ABCDEF"[bVar15 >> 4];
              pbVar7[2] = "0123456789ABCDEF"[bVar15 & 0xf];
              pbVar7 = pbVar7 + 3;
            }
            else {
              *pbVar7 = bVar15;
              pbVar7 = pbVar7 + 1;
            }
            bVar15 = *pbVar18;
            pbVar18 = pbVar18 + 1;
          } while (bVar15 != 0);
          goto LAB_004218e3;
        }
LAB_0042192f:
        p = (char *)0x0;
      }
      value_00 = local_40;
      value_len = local_48;
      uVar12 = pax->flags;
      if ((uVar12 & 2) != 0) {
        __s_00 = (char *)malloc((local_48 * 4 + 2) / 3 + 1);
        pcVar10 = __s_00;
        uVar3 = value_len;
        pcVar14 = value_00;
        if (__s_00 != (char *)0x0) {
          for (; 2 < uVar3; uVar3 = uVar3 - 3) {
            cVar1 = *pcVar14;
            cVar2 = pcVar14[1];
            bVar15 = pcVar14[2];
            *pcVar10 = base64_encode_digits[(uint)(int)cVar1 >> 2 & 0x3f];
            pcVar10[1] = base64_encode_digits
                         [(((int)cVar2 & 0xf0U) << 8 | ((int)cVar1 & 3U) << 0x10) >> 0xc];
            pcVar10[2] = base64_encode_digits[(uint)(int)CONCAT11(cVar2,bVar15) >> 6 & 0x3f];
            pcVar10[3] = base64_encode_digits[bVar15 & 0x3f];
            pcVar10 = pcVar10 + 4;
            pcVar14 = pcVar14 + 3;
          }
          if (uVar3 == 2) {
            cVar1 = *pcVar14;
            cVar2 = pcVar14[1];
            *pcVar10 = base64_encode_digits[(uint)(int)cVar1 >> 2 & 0x3f];
            pcVar14 = pcVar10 + 2;
            pcVar10[1] = base64_encode_digits
                         [(((int)cVar2 & 0xf0U) << 8 | ((int)cVar1 & 3U) << 0x10) >> 0xc];
            uVar12 = ((int)cVar2 & 0xfU) << 2;
            lVar16 = 3;
LAB_00421a90:
            pcVar10 = pcVar10 + lVar16;
            *pcVar14 = base64_encode_digits[uVar12];
          }
          else if (uVar3 == 1) {
            cVar1 = *pcVar14;
            pcVar14 = pcVar10 + 1;
            *pcVar10 = base64_encode_digits[(uint)(int)cVar1 >> 2 & 0x3f];
            uVar12 = ((int)cVar1 & 3U) << 4;
            lVar16 = 2;
            goto LAB_00421a90;
          }
          *pcVar10 = '\0';
          if (p != (char *)0x0) {
            local_88.s = (char *)0x0;
            local_88.length = 0;
            local_88.buffer_length = 0;
            archive_strncat(&local_88,"LIBARCHIVE.xattr.",0x11);
            archive_strcat(&local_88,p);
            pcVar10 = local_88.s;
            sVar8 = strlen(__s_00);
            add_pax_attr_binary(local_68,pcVar10,__s_00,sVar8);
            archive_string_free(&local_88);
          }
        }
        free(__s_00);
        uVar12 = pax->flags;
      }
      if ((uVar12 & 1) != 0) {
        local_88.s = (char *)0x0;
        local_88.length = 0;
        local_88.buffer_length = 0;
        archive_strncat(&local_88,"SCHILY.xattr.",0xd);
        archive_strcat(&local_88,p);
        add_pax_attr_binary(local_68,local_88.s,value_00,value_len);
        archive_string_free(&local_88);
      }
      wVar5 = wVar5 + L'\xffffffff';
    } while (wVar5 != L'\0');
  }
  return 0;
}

Assistant:

static int
archive_write_pax_header_xattrs(struct archive_write *a,
    struct pax *pax, struct archive_entry *entry)
{
	int i = archive_entry_xattr_reset(entry);

	while (i--) {
		const char *name;
		const void *value;
		char *url_encoded_name = NULL, *encoded_name = NULL;
		size_t size;
		int r;

		archive_entry_xattr_next(entry, &name, &value, &size);
		url_encoded_name = url_encode(name);
		if (url_encoded_name != NULL) {
			/* Convert narrow-character to UTF-8. */
			r = archive_strcpy_l(&(pax->l_url_encoded_name),
			    url_encoded_name, pax->sconv_utf8);
			free(url_encoded_name); /* Done with this. */
			if (r == 0)
				encoded_name = pax->l_url_encoded_name.s;
			else if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
		}

		archive_write_pax_header_xattr(pax, encoded_name,
		    value, size);

	}
	return (ARCHIVE_OK);
}